

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitterPrivate::storeSizes(QSplitterPrivate *this)

{
  long lVar1;
  QSplitterLayoutStruct *pQVar2;
  int iVar3;
  QSize *s;
  qsizetype qVar4;
  const_reference ppQVar5;
  QSplitterPrivate *in_RDI;
  long in_FS_OFFSET;
  QSplitterLayoutStruct *sls;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  while( true ) {
    s = (QSize *)(long)iVar6;
    qVar4 = QList<QSplitterLayoutStruct_*>::size(&in_RDI->list);
    if (qVar4 <= (long)s) break;
    ppQVar5 = QList<QSplitterLayoutStruct_*>::at
                        ((QList<QSplitterLayoutStruct_*> *)in_RDI,(qsizetype)s);
    pQVar2 = *ppQVar5;
    QRect::size((QRect *)CONCAT44(iVar6,in_stack_ffffffffffffffe0));
    iVar3 = pick(in_RDI,s);
    pQVar2->sizer = iVar3;
    iVar6 = iVar6 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterPrivate::storeSizes()
{
    for (int i = 0; i < list.size(); ++i) {
        QSplitterLayoutStruct *sls = list.at(i);
        sls->sizer = pick(sls->rect.size());
    }
}